

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

HRESULT __thiscall Js::SourceTextModuleRecord::PostParseProcess(SourceTextModuleRecord *this)

{
  HRESULT HVar1;
  
  this->wasParsed = true;
  ImportModuleListsFromParser(this);
  HVar1 = ResolveExternalModuleDependencies(this);
  if (-1 < HVar1) {
    HVar1 = PrepareForModuleDeclarationInitialization(this);
    return HVar1;
  }
  ReleaseParserResourcesForHierarchy(this);
  return HVar1;
}

Assistant:

HRESULT SourceTextModuleRecord::PostParseProcess()
    {
        HRESULT hr = NOERROR;
        SetWasParsed();
        ImportModuleListsFromParser();
        hr = ResolveExternalModuleDependencies();

        if (SUCCEEDED(hr))
        {
            hr = PrepareForModuleDeclarationInitialization();
        }
        else
        {
            // Cleanup in case of error.
            this->ReleaseParserResourcesForHierarchy();
        }

        return hr;
    }